

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disflow_avx2.c
# Opt level: O0

void invert_2x2(double *M,double *M_inv)

{
  double dVar1;
  double det_inv;
  double det;
  double *M_inv_local;
  double *M_local;
  
  dVar1 = 1.0 / (*M * M[3] + -(M[1] * M[2]));
  *M_inv = M[3] * dVar1;
  M_inv[1] = -M[1] * dVar1;
  M_inv[2] = -M[2] * dVar1;
  M_inv[3] = *M * dVar1;
  return;
}

Assistant:

static inline void invert_2x2(const double *M, double *M_inv) {
  double det = (M[0] * M[3]) - (M[1] * M[2]);
  assert(det >= 1);
  const double det_inv = 1 / det;

  M_inv[0] = M[3] * det_inv;
  M_inv[1] = -M[1] * det_inv;
  M_inv[2] = -M[2] * det_inv;
  M_inv[3] = M[0] * det_inv;
}